

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase *
CreateArrayAllocation(ExpressionContext *ctx,SynBase *source,TypeBase *type,ExprBase *count)

{
  TypeBase *pTVar1;
  TypeBase *pTVar2;
  int iVar3;
  undefined4 extraout_var;
  ExprBase *pEVar4;
  _func_int **pp_Var5;
  ExprBase *arg1;
  ExprBase *pEVar6;
  undefined4 extraout_var_02;
  TypeUnsizedArray *pTVar7;
  InplaceStr name;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
  pEVar6 = (ExprBase *)CONCAT44(extraout_var,iVar3);
  pTVar1 = ctx->typeInt;
  pp_Var5 = (_func_int **)type->size;
  pEVar6->typeID = 6;
  pEVar6->source = source;
  pEVar6->type = pTVar1;
  pEVar6->next = (ExprBase *)0x0;
  pEVar6->listed = false;
  pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e33d0;
  pEVar6[1]._vptr_ExprBase = pp_Var5;
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
  pEVar4 = (ExprBase *)CONCAT44(extraout_var_00,iVar3);
  pTVar1 = ctx->typeInt;
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
  pp_Var5 = (_func_int **)CONCAT44(extraout_var_01,iVar3);
  pTVar2 = ctx->typeTypeID;
  *(undefined4 *)(pp_Var5 + 1) = 8;
  pp_Var5[2] = (_func_int *)source;
  pp_Var5[3] = (_func_int *)pTVar2;
  pp_Var5[4] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var5 + 5) = 0;
  *pp_Var5 = (_func_int *)&PTR__ExprBase_003e3558;
  pp_Var5[6] = (_func_int *)type;
  pEVar4->typeID = 0x12;
  pEVar4->source = source;
  pEVar4->type = pTVar1;
  pEVar4->next = (ExprBase *)0x0;
  pEVar4->listed = false;
  pEVar4->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3478;
  pEVar4[1]._vptr_ExprBase = pp_Var5;
  pEVar4[1].typeID = 0xd;
  arg1 = CreateCast(ctx,source,count,ctx->typeInt,true);
  name.end = "";
  name.begin = "__newA";
  pEVar6 = CreateFunctionCall3(ctx,source,name,pEVar6,arg1,pEVar4,false,true,true);
  if ((pEVar6 == (ExprBase *)0x0) || (pEVar6->typeID != 0x29)) {
    pEVar6 = (ExprBase *)0x0;
  }
  pEVar4 = pEVar6;
  if (type->typeID != 0) {
    if (0xffff < type->size) {
      anon_unknown.dwarf_ff84f::Stop
                (ctx,source,"ERROR: array element size cannot exceed 65535 bytes");
    }
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    pEVar4 = (ExprBase *)CONCAT44(extraout_var_02,iVar3);
    pTVar7 = ExpressionContext::GetUnsizedArrayType(ctx,type);
    pEVar4->typeID = 0x12;
    pEVar4->source = source;
    pEVar4->type = (TypeBase *)pTVar7;
    pEVar4->next = (ExprBase *)0x0;
    pEVar4->listed = false;
    pEVar4->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3478;
    pEVar4[1]._vptr_ExprBase = (_func_int **)pEVar6;
    pEVar4[1].typeID = 0xd;
  }
  return pEVar4;
}

Assistant:

ExprBase* CreateArrayAllocation(ExpressionContext &ctx, SynBase *source, TypeBase *type, ExprBase *count)
{
	ExprBase *size = new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, ctx.typeInt, type->size);
	ExprBase *typeId = new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, ctx.typeInt, new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, type), EXPR_CAST_REINTERPRET);

	count = CreateCast(ctx, source, count, ctx.typeInt, true);

	ExprFunctionCall *alloc = getType<ExprFunctionCall>(CreateFunctionCall3(ctx, source, InplaceStr("__newA"), size, count, typeId, false, true, true));

	if(isType<TypeError>(type))
		return alloc;

	if(type->size >= 64 * 1024)
		Stop(ctx, source, "ERROR: array element size cannot exceed 65535 bytes");

	return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, ctx.GetUnsizedArrayType(type), alloc, EXPR_CAST_REINTERPRET);
}